

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

_Bool gravity_value_isobject(gravity_value_t v)

{
  gravity_class_t *pgVar1;
  gravity_value_t v_local;
  
  pgVar1 = v.isa;
  if (((((pgVar1 == (gravity_class_t *)0x0) || (pgVar1 == gravity_class_int)) ||
       (pgVar1 == gravity_class_float)) ||
      ((pgVar1 == gravity_class_bool || (pgVar1 == gravity_class_null)))) || (v.field_1.n == 0)) {
    v_local.field_1.n._7_1_ = 0;
  }
  else if ((((pgVar1 == gravity_class_string) || (pgVar1 == gravity_class_object)) ||
           ((pgVar1 == gravity_class_function ||
            (((pgVar1 == gravity_class_closure || (pgVar1 == gravity_class_fiber)) ||
             (pgVar1 == gravity_class_class)))))) ||
          (((pgVar1 == gravity_class_instance || (pgVar1 == gravity_class_module)) ||
           ((pgVar1 == gravity_class_list ||
            (((pgVar1 == gravity_class_map || (pgVar1 == gravity_class_range)) ||
             (pgVar1 == gravity_class_upvalue)))))))) {
    v_local.field_1.n._7_1_ = 1;
  }
  else {
    v_local.field_1.n._7_1_ = 0;
  }
  return (_Bool)v_local.field_1.n._7_1_;
}

Assistant:

bool gravity_value_isobject (gravity_value_t v) {
    // was:
    // if (VALUE_ISA_NOTVALID(v)) return false;
    // if (VALUE_ISA_INT(v)) return false;
    // if (VALUE_ISA_FLOAT(v)) return false;
    // if (VALUE_ISA_BOOL(v)) return false;
    // if (VALUE_ISA_NULL(v)) return false;
    // if (VALUE_ISA_UNDEFINED(v)) return false;
    // return true;

    if ((v.isa == NULL) || (v.isa == gravity_class_int) || (v.isa == gravity_class_float) ||
        (v.isa == gravity_class_bool) || (v.isa == gravity_class_null) || (v.p == NULL)) return false;
    
    // extra check to allow ONLY known objects
    if ((v.isa == gravity_class_string) || (v.isa == gravity_class_object) || (v.isa == gravity_class_function) ||
        (v.isa == gravity_class_closure) || (v.isa == gravity_class_fiber) || (v.isa == gravity_class_class) ||
        (v.isa == gravity_class_instance) || (v.isa == gravity_class_module) || (v.isa == gravity_class_list) ||
        (v.isa == gravity_class_map) || (v.isa == gravity_class_range) || (v.isa == gravity_class_upvalue)) return true;
    
    return false;
}